

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O3

void __thiscall
flatbuffers::cpp::CppGenerator::GenBuilders(CppGenerator *this,StructDef *struct_def)

{
  CodeWriter *this_00;
  Value *type_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  BaseType BVar2;
  FieldDef *pFVar3;
  Namespace *this_01;
  string *psVar4;
  CppGenerator *pCVar5;
  mapped_type *pmVar6;
  long *plVar7;
  pointer ppFVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  pointer ppFVar10;
  undefined8 uVar11;
  size_type *psVar12;
  Value **ppVVar13;
  ulong uVar14;
  _Alloc_hider _Var15;
  StructDef *pSVar16;
  FieldDef **field;
  bool bVar17;
  string offset;
  string name;
  string type;
  string value;
  key_type local_660;
  undefined1 local_640 [38];
  byte local_61a;
  byte local_619;
  string local_618;
  StructDef *local_5f8;
  CppGenerator *local_5f0;
  string local_5e8;
  undefined8 local_5c8;
  undefined4 local_5bc;
  string local_5b8;
  Value **local_598;
  long local_590;
  Value *local_588;
  long lStack_580;
  uint local_574;
  CppGenerator *local_570;
  undefined8 local_568;
  code *local_560;
  code *local_558;
  string local_550;
  string local_530;
  string local_510;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_660,"STRUCT_NAME","");
  EscapeKeyword((string *)local_640,this,(string *)struct_def);
  this_00 = &this->code_;
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_00->value_map_,&local_660);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((undefined1 *)local_640._0_8_ != local_640 + 0x10) {
    operator_delete((void *)local_640._0_8_,local_640._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660._M_dataplus._M_p != &local_660.field_2) {
    operator_delete(local_660._M_dataplus._M_p,local_660.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"struct {{STRUCT_NAME}}Builder {","");
  CodeWriter::operator+=(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"  typedef {{STRUCT_NAME}} Table;","");
  CodeWriter::operator+=(this_00,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  GetBuilder_abi_cxx11_((string *)local_640,this);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)local_640,0,(char *)0x0,0x36eeb2);
  local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
  psVar12 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_660.field_2._M_allocated_capacity = *psVar12;
    local_660.field_2._8_8_ = plVar7[3];
  }
  else {
    local_660.field_2._M_allocated_capacity = *psVar12;
    local_660._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_660._M_string_length = plVar7[1];
  *plVar7 = (long)psVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_660);
  psVar12 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_3f0.field_2._M_allocated_capacity = *psVar12;
    local_3f0.field_2._8_8_ = plVar7[3];
    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  }
  else {
    local_3f0.field_2._M_allocated_capacity = *psVar12;
    local_3f0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_3f0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  CodeWriter::operator+=(this_00,&local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660._M_dataplus._M_p != &local_660.field_2) {
    operator_delete(local_660._M_dataplus._M_p,local_660.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_640._0_8_ != local_640 + 0x10) {
    operator_delete((void *)local_640._0_8_,local_640._16_8_ + 1);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"  ::flatbuffers::uoffset_t start_;","");
  CodeWriter::operator+=(this_00,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  ppFVar10 = (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppFVar8 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_5f8 = struct_def;
  local_5f0 = this;
  if (ppFVar10 == ppFVar8) {
    local_5bc = 0;
  }
  else {
    paVar1 = &local_5e8.field_2;
    uVar11 = 0;
    do {
      pFVar3 = *ppFVar10;
      if (pFVar3->deprecated == false) {
        BVar2 = (pFVar3->value).type.base_type;
        local_574 = BVar2 - BASE_TYPE_UTYPE;
        local_5bc = (undefined4)uVar11;
        if (local_574 < 0xc) {
          local_5c8 = CONCAT44(local_5c8._4_4_,
                               (int)CONCAT71((int7)((ulong)uVar11 >> 8),
                                             pFVar3->presence != kOptional));
        }
        else {
          local_5c8 = (ulong)local_5c8._4_4_ << 0x20;
        }
        local_619 = BVar2 == BASE_TYPE_VECTOR64;
        local_61a = BVar2 - BASE_TYPE_STRING < 2;
        GenFieldOffsetName_abi_cxx11_(&local_660,this,pFVar3);
        Name_abi_cxx11_(&local_5b8,this,pFVar3);
        GenUnderlyingCast((string *)local_640,this,pFVar3,false,&local_5b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
          operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        }
        if ((char)local_5c8 == '\0') {
          local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"");
        }
        else {
          GenDefaultConstant_abi_cxx11_(&local_5b8,this,pFVar3);
        }
        local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_618,"FIELD_NAME","");
        Name_abi_cxx11_(&local_5e8,this,pFVar3);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this_00->value_map_,&local_618);
        std::__cxx11::string::_M_assign((string *)pmVar6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e8._M_dataplus._M_p != paVar1) {
          operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_618._M_dataplus._M_p != &local_618.field_2) {
          operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
        }
        local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_618,"FIELD_TYPE","");
        type_00 = &pFVar3->value;
        GenTypeWire_abi_cxx11_(&local_5e8,local_5f0,&type_00->type," ",true,pFVar3->offset64);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this_00->value_map_,&local_618);
        std::__cxx11::string::_M_assign((string *)pmVar6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e8._M_dataplus._M_p != paVar1) {
          operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_618._M_dataplus._M_p != &local_618.field_2) {
          operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
        }
        local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_618,"ADD_OFFSET","");
        EscapeKeyword(&local_550,local_5f0,(string *)local_5f8);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_550);
        local_598 = &local_588;
        ppVVar13 = (Value **)(plVar7 + 2);
        if ((Value **)*plVar7 == ppVVar13) {
          local_588 = *ppVVar13;
          lStack_580 = plVar7[3];
        }
        else {
          local_588 = *ppVVar13;
          local_598 = (Value **)*plVar7;
        }
        local_590 = plVar7[1];
        *plVar7 = (long)ppVVar13;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_598,(ulong)local_660._M_dataplus._M_p);
        psVar12 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_5e8.field_2._M_allocated_capacity = *psVar12;
          local_5e8.field_2._8_8_ = plVar7[3];
          local_5e8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_5e8.field_2._M_allocated_capacity = *psVar12;
          local_5e8._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_5e8._M_string_length = plVar7[1];
        *plVar7 = (long)psVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this_00->value_map_,&local_618);
        std::__cxx11::string::_M_assign((string *)pmVar6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e8._M_dataplus._M_p != paVar1) {
          operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
        }
        if (local_598 != &local_588) {
          operator_delete(local_598,(ulong)((long)&(local_588->type).base_type + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_550._M_dataplus._M_p != &local_550.field_2) {
          operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_618._M_dataplus._M_p != &local_618.field_2) {
          operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
        }
        local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_618,"ADD_NAME","");
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this_00->value_map_,&local_618);
        std::__cxx11::string::_M_assign((string *)pmVar6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_618._M_dataplus._M_p != &local_618.field_2) {
          operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
        }
        local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_618,"ADD_VALUE","");
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this_00->value_map_,&local_618);
        std::__cxx11::string::_M_assign((string *)pmVar6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_618._M_dataplus._M_p != &local_618.field_2) {
          operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
        }
        if (local_574 < 0xc) {
          GenTypeWire_abi_cxx11_(&local_618,local_5f0,&type_00->type,"",false,pFVar3->offset64);
          local_5e8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"ADD_FN","");
          std::operator+(&local_550,"AddElement<",&local_618);
          this = local_5f0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_550);
          local_598 = &local_588;
          ppVVar13 = (Value **)(plVar7 + 2);
          if ((Value **)*plVar7 == ppVVar13) {
            local_588 = *ppVVar13;
            lStack_580 = plVar7[3];
          }
          else {
            local_588 = *ppVVar13;
            local_598 = (Value **)*plVar7;
          }
          local_590 = plVar7[1];
          *plVar7 = (long)ppVVar13;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&this_00->value_map_,&local_5e8);
          std::__cxx11::string::_M_assign((string *)pmVar6);
          if (local_598 != &local_588) {
            operator_delete(local_598,(ulong)((long)&(local_588->type).base_type + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_550._M_dataplus._M_p != &local_550.field_2) {
            operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
          }
        }
        else if (((type_00->type).base_type == BASE_TYPE_STRUCT) &&
                (((pFVar3->value).type.struct_def)->fixed == true)) {
          local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_618,"ADD_FN","");
          this = local_5f0;
          local_5e8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"AddStruct","");
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&this_00->value_map_,&local_618);
          std::__cxx11::string::_M_assign((string *)pmVar6);
        }
        else {
          local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_618,"ADD_FN","");
          this = local_5f0;
          local_5e8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"AddOffset","");
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&this_00->value_map_,&local_618);
          std::__cxx11::string::_M_assign((string *)pmVar6);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e8._M_dataplus._M_p != paVar1) {
          operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_618._M_dataplus._M_p != &local_618.field_2) {
          operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
        }
        local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_4b0,"  void add_{{FIELD_NAME}}({{FIELD_TYPE}}{{FIELD_NAME}}) {",
                   "");
        CodeWriter::operator+=(this_00,&local_4b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
          operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
        }
        local_4d0._M_allocated_capacity = (size_type)&local_4c0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_4d0,"    fbb_.{{ADD_FN}}(\\","");
        CodeWriter::operator+=(this_00,(string *)&local_4d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_allocated_capacity != &local_4c0) {
          operator_delete((void *)local_4d0._M_allocated_capacity,
                          local_4c0._M_allocated_capacity + 1);
        }
        if ((char)local_5c8 == '\0') {
          local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_430,"{{ADD_OFFSET}}, {{ADD_NAME}});","");
          CodeWriter::operator+=(this_00,&local_430);
          psVar4 = &local_430;
          _Var15._M_p = local_430._M_dataplus._M_p;
        }
        else {
          local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_410,"{{ADD_OFFSET}}, {{ADD_NAME}}, {{ADD_VALUE}});","");
          CodeWriter::operator+=(this_00,&local_410);
          psVar4 = &local_410;
          _Var15._M_p = local_410._M_dataplus._M_p;
        }
        paVar9 = &psVar4->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var15._M_p != paVar9) {
          operator_delete(_Var15._M_p,paVar9->_M_allocated_capacity + 1);
        }
        local_4f0._M_allocated_capacity = (size_type)&local_4e0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"  }","");
        CodeWriter::operator+=(this_00,(string *)&local_4f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f0._M_allocated_capacity != &local_4e0) {
          operator_delete((void *)local_4f0._M_allocated_capacity,
                          local_4e0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
          operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_640._0_8_ != local_640 + 0x10) {
          operator_delete((void *)local_640._0_8_,local_640._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_660._M_dataplus._M_p != &local_660.field_2) {
          operator_delete(local_660._M_dataplus._M_p,local_660.field_2._M_allocated_capacity + 1);
        }
        uVar11 = CONCAT71((int7)((ulong)paVar9 >> 8),local_619 | (byte)local_5bc | local_61a);
        ppFVar8 = *(pointer *)
                   ((long)&(local_5f8->fields).vec.
                           super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                           ._M_impl.super__Vector_impl_data + 8);
      }
      local_5bc = (undefined4)uVar11;
      ppFVar10 = ppFVar10 + 1;
    } while (ppFVar10 != ppFVar8);
  }
  GetBuilder_abi_cxx11_((string *)local_640,this);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)local_640,0,(char *)0x0,0x3619b5);
  pSVar16 = local_5f8;
  local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
  psVar12 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_660.field_2._M_allocated_capacity = *psVar12;
    local_660.field_2._8_8_ = plVar7[3];
  }
  else {
    local_660.field_2._M_allocated_capacity = *psVar12;
    local_660._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_660._M_string_length = plVar7[1];
  *plVar7 = (long)psVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_660);
  psVar12 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_450.field_2._M_allocated_capacity = *psVar12;
    local_450.field_2._8_8_ = plVar7[3];
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  }
  else {
    local_450.field_2._M_allocated_capacity = *psVar12;
    local_450._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_450._M_string_length = plVar7[1];
  *plVar7 = (long)psVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  CodeWriter::operator+=(this_00,&local_450);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660._M_dataplus._M_p != &local_660.field_2) {
    operator_delete(local_660._M_dataplus._M_p,local_660.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_640._0_8_ != local_640 + 0x10) {
    operator_delete((void *)local_640._0_8_,local_640._16_8_ + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"        : fbb_(_fbb) {","");
  CodeWriter::operator+=(this_00,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"    start_ = fbb_.StartTable();","");
  CodeWriter::operator+=(this_00,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"  }","");
  CodeWriter::operator+=(this_00,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,"  ::flatbuffers::Offset<{{STRUCT_NAME}}> Finish() {","");
  CodeWriter::operator+=(this_00,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_130,"    const auto end = fbb_.EndTable(start_);","");
  CodeWriter::operator+=(this_00,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,"    auto o = ::flatbuffers::Offset<{{STRUCT_NAME}}>(end);","");
  CodeWriter::operator+=(this_00,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  ppFVar10 = (pSVar16->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppFVar8 = *(pointer *)
             ((long)&(pSVar16->fields).vec.
                     super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                     ._M_impl.super__Vector_impl_data + 8);
  if (ppFVar10 != ppFVar8) {
    do {
      if (((*ppFVar10)->deprecated == false) && ((*ppFVar10)->presence == kRequired)) {
        local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_660,"FIELD_NAME","");
        Name_abi_cxx11_((string *)local_640,local_5f0,*ppFVar10);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this_00->value_map_,&local_660);
        std::__cxx11::string::_M_assign((string *)pmVar6);
        if ((undefined1 *)local_640._0_8_ != local_640 + 0x10) {
          operator_delete((void *)local_640._0_8_,local_640._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_660._M_dataplus._M_p != &local_660.field_2) {
          operator_delete(local_660._M_dataplus._M_p,local_660.field_2._M_allocated_capacity + 1);
        }
        local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_660,"OFFSET_NAME","");
        GenFieldOffsetName_abi_cxx11_((string *)local_640,local_5f0,*ppFVar10);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this_00->value_map_,&local_660);
        std::__cxx11::string::_M_assign((string *)pmVar6);
        if ((undefined1 *)local_640._0_8_ != local_640 + 0x10) {
          operator_delete((void *)local_640._0_8_,local_640._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_660._M_dataplus._M_p != &local_660.field_2) {
          operator_delete(local_660._M_dataplus._M_p,local_660.field_2._M_allocated_capacity + 1);
        }
        local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_310,"    fbb_.Required(o, {{STRUCT_NAME}}::{{OFFSET_NAME}});",""
                  );
        CodeWriter::operator+=(this_00,&local_310);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
        }
      }
      ppFVar10 = ppFVar10 + 1;
    } while (ppFVar10 != ppFVar8);
  }
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"    return o;","");
  CodeWriter::operator+=(this_00,&local_170);
  pCVar5 = local_5f0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"  }","");
  CodeWriter::operator+=(this_00,&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"};","");
  CodeWriter::operator+=(this_00,&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
  CodeWriter::operator+=(this_00,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,
             "inline ::flatbuffers::Offset<{{STRUCT_NAME}}> Create{{STRUCT_NAME}}(","");
  CodeWriter::operator+=(this_00,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  GetBuilder_abi_cxx11_((string *)local_640,pCVar5);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)local_640,0,(char *)0x0,0x366d58);
  local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
  psVar12 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_660.field_2._M_allocated_capacity = *psVar12;
    local_660.field_2._8_8_ = plVar7[3];
  }
  else {
    local_660.field_2._M_allocated_capacity = *psVar12;
    local_660._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_660._M_string_length = plVar7[1];
  *plVar7 = (long)psVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_660);
  psVar12 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_470.field_2._M_allocated_capacity = *psVar12;
    local_470.field_2._8_8_ = plVar7[3];
    local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  }
  else {
    local_470.field_2._M_allocated_capacity = *psVar12;
    local_470._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_470._M_string_length = plVar7[1];
  *plVar7 = (long)psVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  CodeWriter::operator+=(this_00,&local_470);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660._M_dataplus._M_p != &local_660.field_2) {
    operator_delete(local_660._M_dataplus._M_p,local_660.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_640._0_8_ != local_640 + 0x10) {
    operator_delete((void *)local_640._0_8_,local_640._16_8_ + 1);
  }
  ppFVar8 = *(pointer *)
             ((long)&(local_5f8->fields).vec.
                     super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                     ._M_impl.super__Vector_impl_data + 8);
  for (ppFVar10 = (local_5f8->fields).vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppFVar10 != ppFVar8;
      ppFVar10 = ppFVar10 + 1) {
    if ((*ppFVar10)->deprecated == false) {
      GenParam(pCVar5,*ppFVar10,false,",\n    ");
    }
  }
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,") {","");
  CodeWriter::operator+=(this_00,&local_210);
  pSVar16 = local_5f8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_230,"  {{STRUCT_NAME}}Builder builder_(_fbb);","");
  CodeWriter::operator+=(this_00,&local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  local_5c8 = 1;
  if (pSVar16->sortbysize != false) {
    local_5c8 = 8;
  }
  paVar1 = &local_250.field_2;
  ppFVar10 = (pSVar16->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  do {
    ppFVar8 = (pSVar16->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar8 != ppFVar10) {
      do {
        pFVar3 = ppFVar8[-1];
        if (pFVar3->deprecated == false) {
          if (local_5f8->sortbysize == true) {
            uVar14 = (ulong)(pFVar3->value).type.base_type;
            if (0x12 < uVar14) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/idl.h"
                            ,0x9f,"size_t flatbuffers::SizeOf(const BaseType)");
            }
            if (local_5c8 != *(ulong *)(&DAT_0035d998 + uVar14 * 8)) goto LAB_0018f6a1;
          }
          local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_660,"FIELD_NAME","");
          Name_abi_cxx11_((string *)local_640,local_5f0,pFVar3);
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&this_00->value_map_,&local_660);
          std::__cxx11::string::_M_assign((string *)pmVar6);
          if ((undefined1 *)local_640._0_8_ != local_640 + 0x10) {
            operator_delete((void *)local_640._0_8_,local_640._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_660._M_dataplus._M_p != &local_660.field_2) {
            operator_delete(local_660._M_dataplus._M_p,local_660.field_2._M_allocated_capacity + 1);
          }
          if (((pFVar3->value).type.base_type - BASE_TYPE_UTYPE < 0xc) &&
             (pFVar3->presence == kOptional)) {
            local_250._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_250,
                       "  if({{FIELD_NAME}}) { builder_.add_{{FIELD_NAME}}(*{{FIELD_NAME}}); }","");
            CodeWriter::operator+=(this_00,&local_250);
            paVar9 = paVar1;
            _Var15._M_p = local_250._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != paVar1) {
LAB_0018f696:
              operator_delete(_Var15._M_p,paVar9->_M_allocated_capacity + 1);
            }
          }
          else {
            paVar9 = &local_270.field_2;
            local_270._M_dataplus._M_p = (pointer)paVar9;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_270,"  builder_.add_{{FIELD_NAME}}({{FIELD_NAME}});","");
            CodeWriter::operator+=(this_00,&local_270);
            _Var15._M_p = local_270._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_270._M_dataplus._M_p != paVar9) goto LAB_0018f696;
          }
        }
LAB_0018f6a1:
        ppFVar10 = ppFVar8 + -1;
        pSVar16 = local_5f8;
        ppFVar8 = ppFVar10;
      } while (ppFVar10 !=
               (local_5f8->fields).vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_start);
    }
    uVar14 = local_5c8 >> 1;
    bVar17 = 1 < local_5c8;
    local_5c8 = uVar14;
  } while (bVar17);
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_290,"  return builder_.Finish();","");
  CodeWriter::operator+=(this_00,&local_290);
  pCVar5 = local_5f0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"}","");
  CodeWriter::operator+=(this_00,&local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
  CodeWriter::operator+=(this_00,&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if (1 < *(int *)&(pCVar5->opts_).super_IDLOptions.field_0x30c) {
    GenTraitsStruct(pCVar5,local_5f8);
  }
  if (((byte)local_5bc & (pCVar5->opts_).super_IDLOptions.cpp_direct_copy) != 1) {
    return;
  }
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2f0,
             "inline ::flatbuffers::Offset<{{STRUCT_NAME}}> Create{{STRUCT_NAME}}Direct(","");
  CodeWriter::operator+=(this_00,&local_2f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  GetBuilder_abi_cxx11_((string *)local_640,pCVar5);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)local_640,0,(char *)0x0,0x366d58);
  local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
  psVar12 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_660.field_2._M_allocated_capacity = *psVar12;
    local_660.field_2._8_8_ = plVar7[3];
  }
  else {
    local_660.field_2._M_allocated_capacity = *psVar12;
    local_660._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_660._M_string_length = plVar7[1];
  *plVar7 = (long)psVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_660);
  psVar12 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_490.field_2._M_allocated_capacity = *psVar12;
    local_490.field_2._8_8_ = plVar7[3];
    local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
  }
  else {
    local_490.field_2._M_allocated_capacity = *psVar12;
    local_490._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_490._M_string_length = plVar7[1];
  *plVar7 = (long)psVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  CodeWriter::operator+=(this_00,&local_490);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660._M_dataplus._M_p != &local_660.field_2) {
    operator_delete(local_660._M_dataplus._M_p,local_660.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_640._0_8_ != local_640 + 0x10) {
    operator_delete((void *)local_640._0_8_,local_640._16_8_ + 1);
  }
  ppFVar8 = *(pointer *)
             ((long)&(local_5f8->fields).vec.
                     super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                     ._M_impl.super__Vector_impl_data + 8);
  for (ppFVar10 = (local_5f8->fields).vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppFVar10 != ppFVar8;
      ppFVar10 = ppFVar10 + 1) {
    if ((*ppFVar10)->deprecated == false) {
      GenParam(pCVar5,*ppFVar10,true,",\n    ");
    }
  }
  this_01 = (local_5f8->super_Definition).defined_namespace;
  local_640._0_8_ = local_640 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_640,"Create","");
  Namespace::GetFullyQualifiedName(&local_660,this_01,(string *)local_640,1000);
  if ((undefined1 *)local_640._0_8_ != local_640 + 0x10) {
    operator_delete((void *)local_640._0_8_,local_640._16_8_ + 1);
  }
  local_640._0_8_ = local_640 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_640,"CREATE_NAME","");
  TranslateNameSpace(&local_5b8,&local_660);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_00->value_map_,(key_type *)local_640);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
    operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
  }
  if ((FieldDef *)local_640._0_8_ != (FieldDef *)(local_640 + 0x10)) {
    operator_delete((void *)local_640._0_8_,local_640._16_8_ + 1);
  }
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,") {","");
  CodeWriter::operator+=(this_00,&local_330);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  local_568 = 0;
  local_570 = pCVar5;
  local_558 = std::
              _Function_handler<void_(const_flatbuffers::FieldDef_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_cpp.cpp:3111:47)>
              ::_M_invoke;
  local_560 = std::
              _Function_handler<void_(const_flatbuffers::FieldDef_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_cpp.cpp:3111:47)>
              ::_M_manager;
  ppFVar10 = (local_5f8->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppFVar8 = *(pointer *)
             ((long)&(local_5f8->fields).vec.
                     super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                     ._M_impl.super__Vector_impl_data + 8);
  if (ppFVar10 != ppFVar8) {
    do {
      pFVar3 = *ppFVar10;
      if (pFVar3->offset64 == true) {
        local_640._0_8_ = pFVar3;
        if (local_560 == (code *)0x0) goto LAB_0018ffb2;
        (*local_558)(&local_570,local_640);
      }
      ppFVar10 = ppFVar10 + 1;
    } while (ppFVar10 != ppFVar8);
    ppFVar10 = (local_5f8->fields).vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppFVar8 = *(pointer *)
               ((long)&(local_5f8->fields).vec.
                       super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                       ._M_impl.super__Vector_impl_data + 8);
    if (ppFVar10 != ppFVar8) {
      do {
        pFVar3 = *ppFVar10;
        if (pFVar3->offset64 == false) {
          local_640._0_8_ = pFVar3;
          if (local_560 == (code *)0x0) {
LAB_0018ffb2:
            uVar11 = std::__throw_bad_function_call();
            __clang_call_terminate(uVar11);
          }
          (*local_558)(&local_570,local_640);
        }
        ppFVar10 = ppFVar10 + 1;
      } while (ppFVar10 != ppFVar8);
    }
    if (local_560 == (code *)0x0) goto LAB_0018fc19;
  }
  (*local_560)(&local_570,&local_570,3);
LAB_0018fc19:
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_350,"  return {{CREATE_NAME}}{{STRUCT_NAME}}(","");
  CodeWriter::operator+=(this_00,&local_350);
  pSVar16 = local_5f8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"      _fbb\\","");
  CodeWriter::operator+=(this_00,&local_370);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
  }
  ppFVar10 = (pSVar16->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppFVar8 = *(pointer *)
             ((long)&(pSVar16->fields).vec.
                     super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                     ._M_impl.super__Vector_impl_data + 8);
  if (ppFVar10 != ppFVar8) {
    do {
      if ((*ppFVar10)->deprecated == false) {
        local_640._0_8_ = local_640 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_640,"FIELD_NAME","");
        Name_abi_cxx11_(&local_5b8,local_5f0,*ppFVar10);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this_00->value_map_,(key_type *)local_640);
        std::__cxx11::string::_M_assign((string *)pmVar6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
          operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        }
        if ((FieldDef *)local_640._0_8_ != (FieldDef *)(local_640 + 0x10)) {
          operator_delete((void *)local_640._0_8_,local_640._16_8_ + 1);
        }
        local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_510,",\n      {{FIELD_NAME}}\\","");
        CodeWriter::operator+=(this_00,&local_510);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_510._M_dataplus._M_p != &local_510.field_2) {
          operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
        }
        BVar2 = ((*ppFVar10)->value).type.base_type;
        if ((BVar2 < (BASE_TYPE_VECTOR64|BASE_TYPE_UTYPE)) &&
           ((0x46000U >> (BVar2 & (BASE_TYPE_UNION|BASE_TYPE_STRUCT)) & 1) != 0)) {
          local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"__\\","");
          CodeWriter::operator+=(this_00,&local_530);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_530._M_dataplus._M_p != &local_530.field_2) {
            operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
          }
        }
      }
      ppFVar10 = ppFVar10 + 1;
    } while (ppFVar10 != ppFVar8);
  }
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,");","");
  CodeWriter::operator+=(this_00,&local_390);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"}","");
  CodeWriter::operator+=(this_00,&local_3b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"");
  CodeWriter::operator+=(this_00,&local_3d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660._M_dataplus._M_p != &local_660.field_2) {
    operator_delete(local_660._M_dataplus._M_p,local_660.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenBuilders(const StructDef &struct_def) {
    code_.SetValue("STRUCT_NAME", Name(struct_def));

    // Generate a builder struct:
    code_ += "struct {{STRUCT_NAME}}Builder {";
    code_ += "  typedef {{STRUCT_NAME}} Table;";
    code_ += "  " + GetBuilder() + " &fbb_;";
    code_ += "  ::flatbuffers::uoffset_t start_;";

    bool has_string_or_vector_fields = false;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      if (field.deprecated) continue;
      const bool is_scalar = IsScalar(field.value.type.base_type);
      const bool is_default_scalar = is_scalar && !field.IsScalarOptional();
      const bool is_string = IsString(field.value.type);
      const bool is_vector = IsVector(field.value.type);
      if (is_string || is_vector) { has_string_or_vector_fields = true; }

      std::string offset = GenFieldOffsetName(field);
      std::string name = GenUnderlyingCast(field, false, Name(field));
      std::string value = is_default_scalar ? GenDefaultConstant(field) : "";

      // Generate accessor functions of the form:
      // void add_name(type name) {
      //   fbb_.AddElement<type>(offset, name, default);
      // }
      code_.SetValue("FIELD_NAME", Name(field));
      code_.SetValue("FIELD_TYPE",
                     GenTypeWire(field.value.type, " ", true, field.offset64));
      code_.SetValue("ADD_OFFSET", Name(struct_def) + "::" + offset);
      code_.SetValue("ADD_NAME", name);
      code_.SetValue("ADD_VALUE", value);
      if (is_scalar) {
        const auto type =
            GenTypeWire(field.value.type, "", false, field.offset64);
        code_.SetValue("ADD_FN", "AddElement<" + type + ">");
      } else if (IsStruct(field.value.type)) {
        code_.SetValue("ADD_FN", "AddStruct");
      } else {
        code_.SetValue("ADD_FN", "AddOffset");
      }

      code_ += "  void add_{{FIELD_NAME}}({{FIELD_TYPE}}{{FIELD_NAME}}) {";
      code_ += "    fbb_.{{ADD_FN}}(\\";
      if (is_default_scalar) {
        code_ += "{{ADD_OFFSET}}, {{ADD_NAME}}, {{ADD_VALUE}});";
      } else {
        code_ += "{{ADD_OFFSET}}, {{ADD_NAME}});";
      }
      code_ += "  }";
    }

    // Builder constructor
    code_ += "  explicit {{STRUCT_NAME}}Builder(" + GetBuilder() +
             " "
             "&_fbb)";
    code_ += "        : fbb_(_fbb) {";
    code_ += "    start_ = fbb_.StartTable();";
    code_ += "  }";

    // Finish() function.
    code_ += "  ::flatbuffers::Offset<{{STRUCT_NAME}}> Finish() {";
    code_ += "    const auto end = fbb_.EndTable(start_);";
    code_ += "    auto o = ::flatbuffers::Offset<{{STRUCT_NAME}}>(end);";

    for (const auto &field : struct_def.fields.vec) {
      if (!field->deprecated && field->IsRequired()) {
        code_.SetValue("FIELD_NAME", Name(*field));
        code_.SetValue("OFFSET_NAME", GenFieldOffsetName(*field));
        code_ += "    fbb_.Required(o, {{STRUCT_NAME}}::{{OFFSET_NAME}});";
      }
    }
    code_ += "    return o;";
    code_ += "  }";
    code_ += "};";
    code_ += "";

    // Generate a convenient CreateX function that uses the above builder
    // to create a table in one go.
    code_ +=
        "inline ::flatbuffers::Offset<{{STRUCT_NAME}}> "
        "Create{{STRUCT_NAME}}(";
    code_ += "    " + GetBuilder() + " &_fbb\\";
    for (const auto &field : struct_def.fields.vec) {
      if (!field->deprecated) { GenParam(*field, false, ",\n    "); }
    }
    code_ += ") {";

    code_ += "  {{STRUCT_NAME}}Builder builder_(_fbb);";
    for (size_t size = struct_def.sortbysize ? sizeof(largest_scalar_t) : 1;
         size; size /= 2) {
      for (auto it = struct_def.fields.vec.rbegin();
           it != struct_def.fields.vec.rend(); ++it) {
        const auto &field = **it;
        if (!field.deprecated && (!struct_def.sortbysize ||
                                  size == SizeOf(field.value.type.base_type))) {
          code_.SetValue("FIELD_NAME", Name(field));
          if (field.IsScalarOptional()) {
            code_ +=
                "  if({{FIELD_NAME}}) { "
                "builder_.add_{{FIELD_NAME}}(*{{FIELD_NAME}}); }";
          } else {
            code_ += "  builder_.add_{{FIELD_NAME}}({{FIELD_NAME}});";
          }
        }
      }
    }
    code_ += "  return builder_.Finish();";
    code_ += "}";
    code_ += "";

    // Definition for type traits for this table type. This allows querying var-
    // ious compile-time traits of the table.
    if (opts_.g_cpp_std >= cpp::CPP_STD_17) { GenTraitsStruct(struct_def); }

    // Generate a CreateXDirect function with vector types as parameters
    if (opts_.cpp_direct_copy && has_string_or_vector_fields) {
      code_ +=
          "inline ::flatbuffers::Offset<{{STRUCT_NAME}}> "
          "Create{{STRUCT_NAME}}Direct(";
      code_ += "    " + GetBuilder() + " &_fbb\\";
      for (const auto &field : struct_def.fields.vec) {
        if (!field->deprecated) { GenParam(*field, true, ",\n    "); }
      }
      // Need to call "Create" with the struct namespace.
      const auto qualified_create_name =
          struct_def.defined_namespace->GetFullyQualifiedName("Create");
      code_.SetValue("CREATE_NAME", TranslateNameSpace(qualified_create_name));
      code_ += ") {";
      // Offset64 bit fields need to be added to the buffer first, so here we
      // loop over the fields in order of their offset size, followed by their
      // definition order. Otherwise the emitted code might add a Offset
      // followed by an Offset64 which would trigger an assertion.

      // TODO(derekbailey): maybe optimize for the case where there is no
      // 64offsets in the whole schema?
      ForAllFieldsOrderedByOffset(struct_def, [&](const FieldDef *field) {
        if (field->deprecated) { return; }
        code_.SetValue("FIELD_NAME", Name(*field));
        if (IsString(field->value.type)) {
          if (!field->shared) {
            code_.SetValue(
                "CREATE_STRING",
                "CreateString" + std::string(field->offset64
                                                 ? "<::flatbuffers::Offset64>"
                                                 : ""));
          } else {
            code_.SetValue("CREATE_STRING", "CreateSharedString");
          }
          code_ +=
              "  auto {{FIELD_NAME}}__ = {{FIELD_NAME}} ? "
              "_fbb.{{CREATE_STRING}}({{FIELD_NAME}}) : 0;";
        } else if (IsVector(field->value.type)) {
          const std::string force_align_code =
              GenVectorForceAlign(*field, Name(*field) + "->size()");
          if (!force_align_code.empty()) {
            code_ += "  if ({{FIELD_NAME}}) { " + force_align_code + " }";
          }
          code_ += "  auto {{FIELD_NAME}}__ = {{FIELD_NAME}} ? \\";
          const auto vtype = field->value.type.VectorType();
          const auto has_key = TypeHasKey(vtype);
          if (IsStruct(vtype)) {
            const std::string type = WrapInNameSpace(*vtype.struct_def);
            if (has_key) {
              code_ += "_fbb.CreateVectorOfSortedStructs<" + type + ">\\";
            } else {
              // If the field uses 64-bit addressing, create a 64-bit vector.
              if (field->value.type.base_type == BASE_TYPE_VECTOR64) {
                code_ += "_fbb.CreateVectorOfStructs64\\";
              } else {
                code_ += "_fbb.CreateVectorOfStructs\\";
                if (field->offset64) {
                  // This is normal 32-bit vector, with 64-bit addressing.
                  code_ += "64<::flatbuffers::Vector>\\";
                } else {
                  code_ += "<" + type + ">\\";
                }
              }
            }
          } else if (has_key) {
            const auto type = WrapInNameSpace(*vtype.struct_def);
            code_ += "_fbb.CreateVectorOfSortedTables<" + type + ">\\";
          } else {
            const auto type = GenTypeWire(
                vtype, "", VectorElementUserFacing(vtype), field->offset64);

            if (field->value.type.base_type == BASE_TYPE_VECTOR64) {
              code_ += "_fbb.CreateVector64\\";
            } else {
              // If the field uses 64-bit addressing, create a 64-bit vector.
              code_.SetValue("64OFFSET", field->offset64 ? "64" : "");
              code_.SetValue("TYPE",
                             field->offset64 ? "::flatbuffers::Vector" : type);

              code_ += "_fbb.CreateVector{{64OFFSET}}<{{TYPE}}>\\";
            }
          }
          code_ += has_key ? "({{FIELD_NAME}}) : 0;" : "(*{{FIELD_NAME}}) : 0;";
        }
      });
      code_ += "  return {{CREATE_NAME}}{{STRUCT_NAME}}(";
      code_ += "      _fbb\\";
      for (const auto &field : struct_def.fields.vec) {
        if (field->deprecated) { continue; }
        code_.SetValue("FIELD_NAME", Name(*field));
        code_ += ",\n      {{FIELD_NAME}}\\";
        if (IsString(field->value.type) || IsVector(field->value.type)) {
          code_ += "__\\";
        }
      }
      code_ += ");";
      code_ += "}";
      code_ += "";
    }
  }